

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_POP(void)

{
  if ((DAT_001e1699 & 1) == 0) {
    OpCode_POPnormal();
  }
  else {
    OpCode_POPreverse();
  }
  return;
}

Assistant:

static void OpCode_POP() {
		if (Options::syx.IsReversePOP) OpCode_POPreverse();
		else OpCode_POPnormal();
	}